

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

Error __thiscall asmjit::FileLogger::_log(FileLogger *this,char *data,size_t size)

{
  FILE *__s;
  
  __s = (FILE *)this->_file;
  if (__s != (FILE *)0x0) {
    if (size == 0xffffffffffffffff) {
      size = strlen(data);
    }
    fwrite(data,1,size,__s);
  }
  return 0;
}

Assistant:

Error FileLogger::_log(const char* data, size_t size) noexcept {
  if (!_file)
    return kErrorOk;

  if (size == SIZE_MAX)
    size = strlen(data);

  fwrite(data, 1, size, _file);
  return kErrorOk;
}